

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_update_utf8(archive *a,archive_mstring *aes,char *utf8)

{
  wchar_t wVar1;
  archive_string_conv *len;
  archive_string *in_RDX;
  archive_wstring *in_RSI;
  long in_RDI;
  wchar_t r;
  archive_string_conv *sc;
  archive_string_conv *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  size_t n;
  char *in_stack_ffffffffffffffa8;
  archive *in_stack_ffffffffffffffb0;
  void *_p;
  archive_wstring *paVar2;
  archive_string *paVar3;
  wchar_t local_4;
  
  wVar1 = (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (in_RDX == (archive_string *)0x0) {
    *(undefined4 *)&in_RSI[4].s = 0;
    local_4 = L'\0';
  }
  else {
    in_RSI[1].length = 0;
    paVar2 = in_RSI + 1;
    if (in_RDX == (archive_string *)0x0) {
      _p = (void *)0x0;
    }
    else {
      _p = (void *)strlen((char *)in_RDX);
    }
    archive_strncat((archive_string *)paVar2,_p,(size_t)in_stack_ffffffffffffffb0);
    in_RSI->length = 0;
    in_RSI[2].length = 0;
    *(undefined4 *)&in_RSI[4].s = 2;
    len = archive_string_conversion_from_charset
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,wVar1);
    if (len == (archive_string_conv *)0x0) {
      local_4 = L'\xffffffff';
    }
    else {
      paVar3 = in_RDX;
      paVar2 = in_RSI;
      if (in_RDX == (archive_string *)0x0) {
        n = 0;
      }
      else {
        n = strlen((char *)in_RDX);
      }
      wVar1 = archive_strncpy_l(in_RDX,in_RSI,n,in_stack_ffffffffffffff98);
      if (in_RDI == 0) {
        free_sconv_object((archive_string_conv *)0x27dcc6);
      }
      if (wVar1 == L'\0') {
        *(undefined4 *)&paVar2[4].s = 3;
        wVar1 = archive_wstring_append_from_mbs(paVar2,(char *)paVar3,(size_t)len);
        if (wVar1 == L'\0') {
          *(undefined4 *)&paVar2[4].s = 7;
          local_4 = L'\0';
        }
        else {
          local_4 = L'\xffffffff';
        }
      }
      else {
        local_4 = L'\xffffffff';
      }
    }
  }
  return local_4;
}

Assistant:

int
archive_mstring_update_utf8(struct archive *a, struct archive_mstring *aes,
    const char *utf8)
{
	struct archive_string_conv *sc;
	int r;

	if (utf8 == NULL) {
		aes->aes_set = 0;
		return (0); /* Succeeded in clearing everything. */
	}

	/* Save the UTF8 string. */
	archive_strcpy(&(aes->aes_utf8), utf8);

	/* Empty the mbs and wcs strings. */
	archive_string_empty(&(aes->aes_mbs));
	archive_wstring_empty(&(aes->aes_wcs));

	aes->aes_set = AES_SET_UTF8;	/* Only UTF8 is set now. */

	/* Try converting UTF-8 to MBS, return false on failure. */
	sc = archive_string_conversion_from_charset(a, "UTF-8", 1);
	if (sc == NULL)
		return (-1);/* Couldn't allocate memory for sc. */
	r = archive_strcpy_l(&(aes->aes_mbs), utf8, sc);
	if (a == NULL)
		free_sconv_object(sc);
	if (r != 0)
		return (-1);
	aes->aes_set = AES_SET_UTF8 | AES_SET_MBS; /* Both UTF8 and MBS set. */

	/* Try converting MBS to WCS, return false on failure. */
	if (archive_wstring_append_from_mbs(&(aes->aes_wcs), aes->aes_mbs.s,
	    aes->aes_mbs.length))
		return (-1);
	aes->aes_set = AES_SET_UTF8 | AES_SET_WCS | AES_SET_MBS;

	/* All conversions succeeded. */
	return (0);
}